

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Matcher::MatchSingleCharCaseInsensitive
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset,Char c)

{
  uint64 *puVar1;
  Type TVar2;
  code *pcVar3;
  MappingSource mappingSource;
  bool bVar4;
  undefined4 *puVar5;
  Program *pPVar6;
  GroupInfo *pGVar7;
  Type TVar8;
  
  pPVar6 = (this->program).ptr;
  mappingSource = pPVar6->flags >> 3 & CaseFolding;
  if ((pPVar6->flags & StickyRegexFlag) == NoRegexFlags) {
    if (offset < inputLength) {
      do {
        if (this->stats != (Type)0x0) {
          puVar1 = &this->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        bVar4 = MatchSingleCharCaseInsensitiveHere(this,mappingSource,input,offset,c);
        if (bVar4) {
          if (((this->program).ptr)->numGroups == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                               ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                               "groupId >= 0 && groupId < program->numGroups");
            if (!bVar4) goto LAB_00eec819;
            *puVar5 = 0;
          }
          pGVar7 = (this->groupInfos).ptr;
          goto LAB_00eec7fd;
        }
        offset = offset + 1;
      } while (inputLength != offset);
      pPVar6 = (this->program).ptr;
    }
    if (pPVar6->numGroups == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                         "groupId >= 0 && groupId < program->numGroups");
      if (!bVar4) goto LAB_00eec819;
      *puVar5 = 0;
    }
    pGVar7 = (this->groupInfos).ptr;
  }
  else {
    if (this->stats != (Type)0x0) {
      puVar1 = &this->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    bVar4 = MatchSingleCharCaseInsensitiveHere(this,mappingSource,input,offset,c);
    TVar2 = ((this->program).ptr)->numGroups;
    if (bVar4) {
      if (TVar2 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                           "groupId >= 0 && groupId < program->numGroups");
        if (!bVar4) goto LAB_00eec819;
        *puVar5 = 0;
      }
      pGVar7 = (this->groupInfos).ptr;
LAB_00eec7fd:
      pGVar7->offset = offset;
      bVar4 = true;
      TVar8 = 1;
      goto LAB_00eec807;
    }
    if (TVar2 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                         "groupId >= 0 && groupId < program->numGroups");
      if (!bVar4) {
LAB_00eec819:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pGVar7 = (this->groupInfos).ptr;
  }
  TVar8 = 0xffffffff;
  bVar4 = false;
LAB_00eec807:
  pGVar7->length = TVar8;
  return bVar4;
}

Assistant:

inline bool Matcher::MatchSingleCharCaseInsensitive(const Char* const input, const CharCount inputLength, CharCount offset, const Char c)
    {
        CaseInsensitive::MappingSource mappingSource = program->GetCaseMappingSource();

        // If sticky flag is present, break since the 1st character didn't match the pattern character
        if ((program->flags & StickyRegexFlag) != 0)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            else
            {
                ResetGroup(0);
                return false;
            }
        }

        while (offset < inputLength)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            offset++;
        }

        ResetGroup(0);
        return false;
    }